

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O2

void __thiscall TestClass2::~TestClass2(TestClass2 *this)

{
  operator_delete(this->m_DoublePtr,8);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~TestClass2() {
        delete m_DoublePtr;
    }